

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_1,_false,_embree::avx::SubGridIntersector1Moeller<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  undefined1 auVar11 [32];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined4 uVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  uint uVar97;
  int iVar98;
  long lVar99;
  ulong uVar100;
  ulong uVar101;
  long lVar102;
  uint uVar103;
  ulong uVar104;
  uint uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  undefined4 uVar110;
  ulong unaff_R12;
  size_t mask;
  GridMesh *mesh;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  long lVar114;
  long lVar115;
  bool bVar116;
  float fVar117;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar146 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  uint uVar181;
  float fVar185;
  uint uVar186;
  float fVar187;
  uint uVar188;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar189;
  uint uVar190;
  float fVar191;
  uint uVar192;
  float fVar193;
  uint uVar194;
  float fVar195;
  uint uVar196;
  undefined1 auVar184 [32];
  uint uVar197;
  float fVar198;
  float fVar201;
  float fVar202;
  undefined1 auVar199 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [32];
  float fVar207;
  undefined1 auVar208 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [564];
  int local_1664;
  ulong local_1660;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong *local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  long local_15c8;
  float local_15c0;
  float local_15bc;
  float local_15b8;
  float local_15b4;
  float local_15b0;
  uint local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined1 local_13e0 [32];
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1320 [32];
  float local_1300 [4];
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar117 = ray->tfar;
    if (0.0 <= fVar117) {
      local_1628 = local_11f8;
      aVar2 = (ray->dir).field_0;
      auVar118 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147 = vandps_avx((undefined1  [16])aVar2,auVar147);
      auVar157._8_4_ = 0x219392ef;
      auVar157._0_8_ = 0x219392ef219392ef;
      auVar157._12_4_ = 0x219392ef;
      auVar147 = vcmpps_avx(auVar147,auVar157,1);
      auVar147 = vblendvps_avx((undefined1  [16])aVar2,auVar157,auVar147);
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar157 = vrcpps_avx(auVar147);
      fVar122 = auVar157._0_4_;
      auVar143._0_4_ = fVar122 * auVar147._0_4_;
      fVar123 = auVar157._4_4_;
      auVar143._4_4_ = fVar123 * auVar147._4_4_;
      fVar124 = auVar157._8_4_;
      auVar143._8_4_ = fVar124 * auVar147._8_4_;
      fVar126 = auVar157._12_4_;
      auVar143._12_4_ = fVar126 * auVar147._12_4_;
      auVar158._8_4_ = 0x3f800000;
      auVar158._0_8_ = &DAT_3f8000003f800000;
      auVar158._12_4_ = 0x3f800000;
      auVar147 = vsubps_avx(auVar158,auVar143);
      uVar110 = *(undefined4 *)&(ray->org).field_0;
      local_1480._4_4_ = uVar110;
      local_1480._0_4_ = uVar110;
      local_1480._8_4_ = uVar110;
      local_1480._12_4_ = uVar110;
      local_1480._16_4_ = uVar110;
      local_1480._20_4_ = uVar110;
      local_1480._24_4_ = uVar110;
      local_1480._28_4_ = uVar110;
      auVar209 = ZEXT3264(local_1480);
      uVar110 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_14a0._4_4_ = uVar110;
      local_14a0._0_4_ = uVar110;
      local_14a0._8_4_ = uVar110;
      local_14a0._12_4_ = uVar110;
      local_14a0._16_4_ = uVar110;
      local_14a0._20_4_ = uVar110;
      local_14a0._24_4_ = uVar110;
      local_14a0._28_4_ = uVar110;
      auVar217 = ZEXT3264(local_14a0);
      uVar110 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_14c0._4_4_ = uVar110;
      local_14c0._0_4_ = uVar110;
      local_14c0._8_4_ = uVar110;
      local_14c0._12_4_ = uVar110;
      local_14c0._16_4_ = uVar110;
      local_14c0._20_4_ = uVar110;
      local_14c0._24_4_ = uVar110;
      local_14c0._28_4_ = uVar110;
      auVar219 = ZEXT3264(local_14c0);
      auVar144._0_4_ = fVar122 + fVar122 * auVar147._0_4_;
      auVar144._4_4_ = fVar123 + fVar123 * auVar147._4_4_;
      auVar144._8_4_ = fVar124 + fVar124 * auVar147._8_4_;
      auVar144._12_4_ = fVar126 + fVar126 * auVar147._12_4_;
      auVar147 = vshufps_avx(auVar144,auVar144,0);
      local_14e0._16_16_ = auVar147;
      local_14e0._0_16_ = auVar147;
      auVar221 = ZEXT3264(local_14e0);
      auVar147 = vmovshdup_avx(auVar144);
      auVar157 = vshufps_avx(auVar144,auVar144,0x55);
      local_1500._16_16_ = auVar157;
      local_1500._0_16_ = auVar157;
      auVar222 = ZEXT3264(local_1500);
      auVar157 = vshufpd_avx(auVar144,auVar144,1);
      auVar143 = vshufps_avx(auVar144,auVar144,0xaa);
      uVar100 = (ulong)(auVar144._0_4_ < 0.0) << 5;
      register0x00001310 = auVar143;
      _local_1400 = auVar143;
      auVar156 = ZEXT3264(_local_1400);
      uVar107 = (ulong)(auVar147._0_4_ < 0.0) << 5 | 0x40;
      uVar108 = (ulong)(auVar157._0_4_ < 0.0) << 5 | 0x80;
      uVar109 = uVar100 ^ 0x20;
      uVar104 = uVar107 ^ 0x20;
      uVar113 = uVar108 ^ 0x20;
      auVar147 = vshufps_avx(auVar118,auVar118,0);
      local_1420._16_16_ = auVar147;
      local_1420._0_16_ = auVar147;
      auVar164 = ZEXT3264(local_1420);
      auVar147 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
      local_1440._16_16_ = auVar147;
      local_1440._0_16_ = auVar147;
      auVar168 = ZEXT3264(local_1440);
      local_15f8 = (ulong)(((uint)(auVar144._0_4_ < 0.0) << 5) >> 2);
      local_1600 = uVar109 >> 2;
      local_1608 = uVar107 >> 2;
      local_1610 = uVar104 >> 2;
      local_13e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_13e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_1618 = uVar108 >> 2;
      local_1220 = vperm2f128_avx(local_13e0,mm_lookupmask_ps._0_32_,2);
      local_1620 = uVar113 >> 2;
      auVar130._8_4_ = 0xbf800000;
      auVar130._0_8_ = 0xbf800000bf800000;
      auVar130._12_4_ = 0xbf800000;
      auVar130._16_4_ = 0xbf800000;
      auVar130._20_4_ = 0xbf800000;
      auVar130._24_4_ = 0xbf800000;
      auVar130._28_4_ = 0xbf800000;
      auVar140._8_4_ = 0x3f800000;
      auVar140._0_8_ = &DAT_3f8000003f800000;
      auVar140._12_4_ = 0x3f800000;
      auVar140._16_4_ = 0x3f800000;
      auVar140._20_4_ = 0x3f800000;
      auVar140._24_4_ = 0x3f800000;
      auVar140._28_4_ = 0x3f800000;
      _local_1240 = vblendvps_avx(auVar140,auVar130,local_1220);
      local_1638 = uVar100;
      local_1640 = uVar107;
      local_1648 = uVar108;
      local_1650 = uVar109;
      local_1658 = uVar104;
      local_1660 = uVar113;
      do {
        if (local_1628 == &local_1200) {
          return;
        }
        uVar112 = local_1628[-1];
        local_1628 = local_1628 + -1;
        local_1630 = unaff_R12;
        do {
          if ((uVar112 & 8) == 0) {
            auVar130 = vsubps_avx(*(undefined1 (*) [32])(uVar112 + 0x40 + uVar100),auVar209._0_32_);
            auVar11._4_4_ = auVar221._4_4_ * auVar130._4_4_;
            auVar11._0_4_ = auVar221._0_4_ * auVar130._0_4_;
            auVar11._8_4_ = auVar221._8_4_ * auVar130._8_4_;
            auVar11._12_4_ = auVar221._12_4_ * auVar130._12_4_;
            auVar11._16_4_ = auVar221._16_4_ * auVar130._16_4_;
            auVar11._20_4_ = auVar221._20_4_ * auVar130._20_4_;
            auVar11._24_4_ = auVar221._24_4_ * auVar130._24_4_;
            auVar11._28_4_ = auVar130._28_4_;
            auVar130 = vsubps_avx(*(undefined1 (*) [32])(uVar112 + 0x40 + uVar107),auVar217._0_32_);
            auVar69._4_4_ = auVar222._4_4_ * auVar130._4_4_;
            auVar69._0_4_ = auVar222._0_4_ * auVar130._0_4_;
            auVar69._8_4_ = auVar222._8_4_ * auVar130._8_4_;
            auVar69._12_4_ = auVar222._12_4_ * auVar130._12_4_;
            auVar69._16_4_ = auVar222._16_4_ * auVar130._16_4_;
            auVar69._20_4_ = auVar222._20_4_ * auVar130._20_4_;
            auVar69._24_4_ = auVar222._24_4_ * auVar130._24_4_;
            auVar69._28_4_ = auVar130._28_4_;
            auVar130 = vmaxps_avx(auVar11,auVar69);
            auVar140 = vsubps_avx(*(undefined1 (*) [32])(uVar112 + 0x40 + uVar108),auVar219._0_32_);
            auVar70._4_4_ = auVar156._4_4_ * auVar140._4_4_;
            auVar70._0_4_ = auVar156._0_4_ * auVar140._0_4_;
            auVar70._8_4_ = auVar156._8_4_ * auVar140._8_4_;
            auVar70._12_4_ = auVar156._12_4_ * auVar140._12_4_;
            auVar70._16_4_ = auVar156._16_4_ * auVar140._16_4_;
            auVar70._20_4_ = auVar156._20_4_ * auVar140._20_4_;
            auVar70._24_4_ = auVar156._24_4_ * auVar140._24_4_;
            auVar70._28_4_ = auVar140._28_4_;
            auVar140 = vsubps_avx(*(undefined1 (*) [32])(uVar112 + 0x40 + uVar109),auVar209._0_32_);
            auVar71._4_4_ = auVar221._4_4_ * auVar140._4_4_;
            auVar71._0_4_ = auVar221._0_4_ * auVar140._0_4_;
            auVar71._8_4_ = auVar221._8_4_ * auVar140._8_4_;
            auVar71._12_4_ = auVar221._12_4_ * auVar140._12_4_;
            auVar71._16_4_ = auVar221._16_4_ * auVar140._16_4_;
            auVar71._20_4_ = auVar221._20_4_ * auVar140._20_4_;
            auVar71._24_4_ = auVar221._24_4_ * auVar140._24_4_;
            auVar71._28_4_ = auVar140._28_4_;
            auVar140 = vsubps_avx(*(undefined1 (*) [32])(uVar112 + 0x40 + uVar104),auVar217._0_32_);
            auVar72._4_4_ = auVar222._4_4_ * auVar140._4_4_;
            auVar72._0_4_ = auVar222._0_4_ * auVar140._0_4_;
            auVar72._8_4_ = auVar222._8_4_ * auVar140._8_4_;
            auVar72._12_4_ = auVar222._12_4_ * auVar140._12_4_;
            auVar72._16_4_ = auVar222._16_4_ * auVar140._16_4_;
            auVar72._20_4_ = auVar222._20_4_ * auVar140._20_4_;
            auVar72._24_4_ = auVar222._24_4_ * auVar140._24_4_;
            auVar72._28_4_ = auVar140._28_4_;
            auVar11 = vminps_avx(auVar71,auVar72);
            auVar140 = vsubps_avx(*(undefined1 (*) [32])(uVar112 + 0x40 + uVar113),auVar219._0_32_);
            auVar73._4_4_ = auVar156._4_4_ * auVar140._4_4_;
            auVar73._0_4_ = auVar156._0_4_ * auVar140._0_4_;
            auVar73._8_4_ = auVar156._8_4_ * auVar140._8_4_;
            auVar73._12_4_ = auVar156._12_4_ * auVar140._12_4_;
            auVar73._16_4_ = auVar156._16_4_ * auVar140._16_4_;
            auVar73._20_4_ = auVar156._20_4_ * auVar140._20_4_;
            auVar73._24_4_ = auVar156._24_4_ * auVar140._24_4_;
            auVar73._28_4_ = auVar140._28_4_;
            auVar140 = vmaxps_avx(auVar70,auVar164._0_32_);
            auVar130 = vmaxps_avx(auVar130,auVar140);
            auVar140 = vminps_avx(auVar73,auVar168._0_32_);
            auVar140 = vminps_avx(auVar11,auVar140);
            auVar130 = vcmpps_avx(auVar130,auVar140,2);
            uVar110 = vmovmskps_avx(auVar130);
            local_1630 = CONCAT44((int)(local_1630 >> 0x20),uVar110);
          }
          if ((uVar112 & 8) == 0) {
            if (local_1630 == 0) {
              iVar98 = 4;
            }
            else {
              uVar111 = uVar112 & 0xfffffffffffffff0;
              lVar99 = 0;
              if (local_1630 != 0) {
                for (; (local_1630 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                }
              }
              iVar98 = 0;
              uVar112 = *(ulong *)(uVar111 + lVar99 * 8);
              uVar106 = local_1630 - 1 & local_1630;
              if (uVar106 != 0) {
                *local_1628 = uVar112;
                lVar99 = 0;
                if (uVar106 != 0) {
                  for (; (uVar106 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                  }
                }
                uVar101 = uVar106 - 1;
                while( true ) {
                  local_1628 = local_1628 + 1;
                  uVar112 = *(ulong *)(uVar111 + lVar99 * 8);
                  uVar101 = uVar101 & uVar106;
                  if (uVar101 == 0) break;
                  *local_1628 = uVar112;
                  lVar99 = 0;
                  if (uVar101 != 0) {
                    for (; (uVar101 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                    }
                  }
                  uVar106 = uVar101 - 1;
                }
              }
            }
          }
          else {
            iVar98 = 6;
          }
        } while (iVar98 == 0);
        if (iVar98 == 6) {
          local_15e8 = (ulong)((uint)uVar112 & 0xf) - 8;
          bVar116 = local_15e8 != 0;
          if (bVar116) {
            local_15e0 = 0;
            local_15f0 = uVar112 & 0xfffffffffffffff0;
            do {
              lVar99 = local_15e0 * 0x90;
              local_15c8 = lVar99 + local_15f0;
              auVar118._8_8_ = 0;
              auVar118._0_8_ = *(ulong *)(local_15f0 + 0x40 + lVar99);
              auVar134._8_8_ = 0;
              auVar134._0_8_ = *(ulong *)(local_15f0 + 0x48 + lVar99);
              auVar147 = vpminub_avx(auVar118,auVar134);
              auVar147 = vpcmpeqb_avx(auVar118,auVar147);
              auVar129._8_8_ = 0;
              auVar129._0_8_ = *(ulong *)(local_15f0 + 0x44 + lVar99);
              auVar145._8_8_ = 0;
              auVar145._0_8_ = *(ulong *)(local_15f0 + 0x4c + lVar99);
              auVar118 = vpminub_avx(auVar129,auVar145);
              fVar117 = *(float *)(local_15f0 + 0x70 + lVar99);
              auVar118 = vpcmpeqb_avx(auVar129,auVar118);
              fVar122 = *(float *)(local_15f0 + 0x7c + lVar99);
              auVar135._8_8_ = 0;
              auVar135._0_8_ = *(ulong *)(local_15f8 + 0x40 + local_15c8);
              auVar157 = vpmovzxbd_avx(auVar135);
              auVar159._8_8_ = 0;
              auVar159._0_8_ = *(ulong *)(local_15f8 + 0x44 + local_15c8);
              auVar143 = vpmovzxbd_avx(auVar159);
              auVar136._16_16_ = auVar143;
              auVar136._0_16_ = auVar157;
              auVar130 = vcvtdq2ps_avx(auVar136);
              auVar137._0_4_ = fVar117 + fVar122 * auVar130._0_4_;
              auVar137._4_4_ = fVar117 + fVar122 * auVar130._4_4_;
              auVar137._8_4_ = fVar117 + fVar122 * auVar130._8_4_;
              auVar137._12_4_ = fVar117 + fVar122 * auVar130._12_4_;
              auVar137._16_4_ = fVar117 + fVar122 * auVar130._16_4_;
              auVar137._20_4_ = fVar117 + fVar122 * auVar130._20_4_;
              auVar137._24_4_ = fVar117 + fVar122 * auVar130._24_4_;
              auVar137._28_4_ = fVar117 + auVar130._28_4_;
              auVar160._8_8_ = 0;
              auVar160._0_8_ = *(ulong *)(local_1600 + 0x40 + local_15c8);
              auVar157 = vpmovzxbd_avx(auVar160);
              auVar165._8_8_ = 0;
              auVar165._0_8_ = *(ulong *)(local_1600 + 0x44 + local_15c8);
              auVar143 = vpmovzxbd_avx(auVar165);
              auVar161._16_16_ = auVar143;
              auVar161._0_16_ = auVar157;
              auVar130 = vcvtdq2ps_avx(auVar161);
              fVar123 = *(float *)(local_15f0 + 0x74 + lVar99);
              auVar148._0_4_ = fVar117 + fVar122 * auVar130._0_4_;
              auVar148._4_4_ = fVar117 + fVar122 * auVar130._4_4_;
              auVar148._8_4_ = fVar117 + fVar122 * auVar130._8_4_;
              auVar148._12_4_ = fVar117 + fVar122 * auVar130._12_4_;
              auVar148._16_4_ = fVar117 + fVar122 * auVar130._16_4_;
              auVar148._20_4_ = fVar117 + fVar122 * auVar130._20_4_;
              auVar148._24_4_ = fVar117 + fVar122 * auVar130._24_4_;
              auVar148._28_4_ = fVar117 + fVar122;
              fVar117 = *(float *)(local_15f0 + 0x80 + lVar99);
              auVar151._8_8_ = 0;
              auVar151._0_8_ = *(ulong *)(local_1608 + 0x40 + local_15c8);
              auVar157 = vpmovzxbd_avx(auVar151);
              auVar169._8_8_ = 0;
              auVar169._0_8_ = *(ulong *)(local_1608 + 0x44 + local_15c8);
              auVar143 = vpmovzxbd_avx(auVar169);
              auVar152._16_16_ = auVar143;
              auVar152._0_16_ = auVar157;
              auVar130 = vcvtdq2ps_avx(auVar152);
              auVar153._0_4_ = fVar123 + fVar117 * auVar130._0_4_;
              auVar153._4_4_ = fVar123 + fVar117 * auVar130._4_4_;
              auVar153._8_4_ = fVar123 + fVar117 * auVar130._8_4_;
              auVar153._12_4_ = fVar123 + fVar117 * auVar130._12_4_;
              auVar153._16_4_ = fVar123 + fVar117 * auVar130._16_4_;
              auVar153._20_4_ = fVar123 + fVar117 * auVar130._20_4_;
              auVar153._24_4_ = fVar123 + fVar117 * auVar130._24_4_;
              auVar153._28_4_ = fVar123 + auVar130._28_4_;
              auVar170._8_8_ = 0;
              auVar170._0_8_ = *(ulong *)(local_1610 + 0x40 + local_15c8);
              auVar157 = vpmovzxbd_avx(auVar170);
              auVar174._8_8_ = 0;
              auVar174._0_8_ = *(ulong *)(local_1610 + 0x44 + local_15c8);
              auVar143 = vpmovzxbd_avx(auVar174);
              auVar172._16_16_ = auVar143;
              auVar172._0_16_ = auVar157;
              auVar130 = vcvtdq2ps_avx(auVar172);
              fVar122 = *(float *)(local_15f0 + 0x78 + lVar99);
              auVar162._0_4_ = fVar123 + fVar117 * auVar130._0_4_;
              auVar162._4_4_ = fVar123 + fVar117 * auVar130._4_4_;
              auVar162._8_4_ = fVar123 + fVar117 * auVar130._8_4_;
              auVar162._12_4_ = fVar123 + fVar117 * auVar130._12_4_;
              auVar162._16_4_ = fVar123 + fVar117 * auVar130._16_4_;
              auVar162._20_4_ = fVar123 + fVar117 * auVar130._20_4_;
              auVar162._24_4_ = fVar123 + fVar117 * auVar130._24_4_;
              auVar162._28_4_ = fVar123 + fVar117;
              fVar117 = *(float *)(local_15f0 + 0x84 + lVar99);
              auVar175._8_8_ = 0;
              auVar175._0_8_ = *(ulong *)(local_1618 + 0x40 + local_15c8);
              auVar157 = vpmovzxbd_avx(auVar175);
              auVar182._8_8_ = 0;
              auVar182._0_8_ = *(ulong *)(local_1618 + 0x44 + local_15c8);
              auVar143 = vpmovzxbd_avx(auVar182);
              auVar176._16_16_ = auVar143;
              auVar176._0_16_ = auVar157;
              auVar183._8_8_ = 0;
              auVar183._0_8_ = *(ulong *)(local_1620 + 0x40 + local_15c8);
              auVar157 = vpmovzxbd_avx(auVar183);
              auVar199._8_8_ = 0;
              auVar199._0_8_ = *(ulong *)(local_1620 + 0x44 + local_15c8);
              auVar143 = vpmovzxbd_avx(auVar199);
              auVar184._16_16_ = auVar143;
              auVar184._0_16_ = auVar157;
              auVar130 = vcvtdq2ps_avx(auVar176);
              auVar140 = vcvtdq2ps_avx(auVar184);
              auVar177._0_4_ = auVar130._0_4_ * fVar117 + fVar122;
              auVar177._4_4_ = auVar130._4_4_ * fVar117 + fVar122;
              auVar177._8_4_ = auVar130._8_4_ * fVar117 + fVar122;
              auVar177._12_4_ = auVar130._12_4_ * fVar117 + fVar122;
              auVar177._16_4_ = auVar130._16_4_ * fVar117 + fVar122;
              auVar177._20_4_ = auVar130._20_4_ * fVar117 + fVar122;
              auVar177._24_4_ = auVar130._24_4_ * fVar117 + fVar122;
              auVar177._28_4_ = auVar130._28_4_ + fVar122;
              auVar166._0_4_ = fVar122 + auVar140._0_4_ * fVar117;
              auVar166._4_4_ = fVar122 + auVar140._4_4_ * fVar117;
              auVar166._8_4_ = fVar122 + auVar140._8_4_ * fVar117;
              auVar166._12_4_ = fVar122 + auVar140._12_4_ * fVar117;
              auVar166._16_4_ = fVar122 + auVar140._16_4_ * fVar117;
              auVar166._20_4_ = fVar122 + auVar140._20_4_ * fVar117;
              auVar166._24_4_ = fVar122 + auVar140._24_4_ * fVar117;
              auVar166._28_4_ = fVar122 + fVar117;
              auVar130 = vsubps_avx(auVar137,auVar209._0_32_);
              auVar74._4_4_ = auVar221._4_4_ * auVar130._4_4_;
              auVar74._0_4_ = auVar221._0_4_ * auVar130._0_4_;
              auVar74._8_4_ = auVar221._8_4_ * auVar130._8_4_;
              auVar74._12_4_ = auVar221._12_4_ * auVar130._12_4_;
              auVar74._16_4_ = auVar221._16_4_ * auVar130._16_4_;
              auVar74._20_4_ = auVar221._20_4_ * auVar130._20_4_;
              auVar74._24_4_ = auVar221._24_4_ * auVar130._24_4_;
              auVar74._28_4_ = auVar130._28_4_;
              auVar130 = vsubps_avx(auVar153,auVar217._0_32_);
              auVar75._4_4_ = auVar222._4_4_ * auVar130._4_4_;
              auVar75._0_4_ = auVar222._0_4_ * auVar130._0_4_;
              auVar75._8_4_ = auVar222._8_4_ * auVar130._8_4_;
              auVar75._12_4_ = auVar222._12_4_ * auVar130._12_4_;
              auVar75._16_4_ = auVar222._16_4_ * auVar130._16_4_;
              auVar75._20_4_ = auVar222._20_4_ * auVar130._20_4_;
              auVar75._24_4_ = auVar222._24_4_ * auVar130._24_4_;
              auVar75._28_4_ = auVar130._28_4_;
              auVar130 = vmaxps_avx(auVar74,auVar75);
              auVar140 = vsubps_avx(auVar148,auVar209._0_32_);
              auVar76._4_4_ = auVar221._4_4_ * auVar140._4_4_;
              auVar76._0_4_ = auVar221._0_4_ * auVar140._0_4_;
              auVar76._8_4_ = auVar221._8_4_ * auVar140._8_4_;
              auVar76._12_4_ = auVar221._12_4_ * auVar140._12_4_;
              auVar76._16_4_ = auVar221._16_4_ * auVar140._16_4_;
              auVar76._20_4_ = auVar221._20_4_ * auVar140._20_4_;
              auVar76._24_4_ = auVar221._24_4_ * auVar140._24_4_;
              auVar76._28_4_ = auVar140._28_4_;
              auVar140 = vsubps_avx(auVar162,auVar217._0_32_);
              auVar77._4_4_ = auVar222._4_4_ * auVar140._4_4_;
              auVar77._0_4_ = auVar222._0_4_ * auVar140._0_4_;
              auVar77._8_4_ = auVar222._8_4_ * auVar140._8_4_;
              auVar77._12_4_ = auVar222._12_4_ * auVar140._12_4_;
              auVar77._16_4_ = auVar222._16_4_ * auVar140._16_4_;
              auVar77._20_4_ = auVar222._20_4_ * auVar140._20_4_;
              auVar77._24_4_ = auVar222._24_4_ * auVar140._24_4_;
              auVar77._28_4_ = auVar140._28_4_;
              auVar11 = vminps_avx(auVar76,auVar77);
              auVar140 = vsubps_avx(auVar177,auVar219._0_32_);
              auVar78._4_4_ = (float)local_1400._4_4_ * auVar140._4_4_;
              auVar78._0_4_ = (float)local_1400._0_4_ * auVar140._0_4_;
              auVar78._8_4_ = fStack_13f8 * auVar140._8_4_;
              auVar78._12_4_ = fStack_13f4 * auVar140._12_4_;
              auVar78._16_4_ = fStack_13f0 * auVar140._16_4_;
              auVar78._20_4_ = fStack_13ec * auVar140._20_4_;
              auVar78._24_4_ = fStack_13e8 * auVar140._24_4_;
              auVar78._28_4_ = auVar140._28_4_;
              auVar140 = vmaxps_avx(auVar78,local_1420);
              auVar130 = vmaxps_avx(auVar130,auVar140);
              auVar140 = vsubps_avx(auVar166,auVar219._0_32_);
              auVar79._4_4_ = (float)local_1400._4_4_ * auVar140._4_4_;
              auVar79._0_4_ = (float)local_1400._0_4_ * auVar140._0_4_;
              auVar79._8_4_ = fStack_13f8 * auVar140._8_4_;
              auVar79._12_4_ = fStack_13f4 * auVar140._12_4_;
              auVar79._16_4_ = fStack_13f0 * auVar140._16_4_;
              auVar79._20_4_ = fStack_13ec * auVar140._20_4_;
              auVar79._24_4_ = fStack_13e8 * auVar140._24_4_;
              auVar79._28_4_ = auVar140._28_4_;
              auVar140 = vminps_avx(auVar79,local_1440);
              auVar140 = vminps_avx(auVar11,auVar140);
              auVar130 = vcmpps_avx(auVar130,auVar140,2);
              auVar157 = vpcmpeqd_avx(auVar140._0_16_,auVar140._0_16_);
              auVar147 = vpmovsxbd_avx(auVar147 ^ auVar157);
              auVar118 = vpmovsxbd_avx(auVar118 ^ auVar157);
              auVar119._16_16_ = auVar118;
              auVar119._0_16_ = auVar147;
              auVar140 = vcvtdq2ps_avx(auVar119);
              auVar131._8_4_ = 0xbf800000;
              auVar131._0_8_ = 0xbf800000bf800000;
              auVar131._12_4_ = 0xbf800000;
              auVar131._16_4_ = 0xbf800000;
              auVar131._20_4_ = 0xbf800000;
              auVar131._24_4_ = 0xbf800000;
              auVar131._28_4_ = 0xbf800000;
              auVar140 = vcmpps_avx(auVar131,auVar140,1);
              auVar130 = vandps_avx(auVar130,auVar140);
              uVar97 = vmovmskps_avx(auVar130);
              if (uVar97 != 0) {
                uVar104 = (ulong)(uVar97 & 0xff);
                do {
                  lVar99 = 0;
                  if (uVar104 != 0) {
                    for (; (uVar104 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                    }
                  }
                  uVar3 = *(ushort *)(local_15c8 + lVar99 * 8);
                  uVar4 = *(ushort *)(local_15c8 + 2 + lVar99 * 8);
                  uVar97 = *(uint *)(local_15c8 + 0x88);
                  uVar5 = *(uint *)(local_15c8 + 4 + lVar99 * 8);
                  local_15d0 = (ulong)uVar97;
                  pGVar6 = (context->scene->geometries).items[uVar97].ptr;
                  lVar99 = *(long *)&pGVar6->field_0x58;
                  local_15d8 = (ulong)uVar5;
                  lVar102 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)uVar5;
                  uVar103 = uVar3 & 0x7fff;
                  uVar105 = uVar4 & 0x7fff;
                  uVar181 = *(uint *)(lVar99 + 4 + lVar102);
                  uVar107 = (ulong)uVar181;
                  uVar108 = (ulong)(uVar181 * uVar105 + *(int *)(lVar99 + lVar102) + uVar103);
                  p_Var7 = pGVar6[1].intersectionFilterN;
                  lVar8 = *(long *)&pGVar6[1].time_range.upper;
                  auVar147 = *(undefined1 (*) [16])(lVar8 + (long)p_Var7 * uVar108);
                  auVar118 = *(undefined1 (*) [16])(lVar8 + (uVar108 + 1) * (long)p_Var7);
                  auVar157 = *(undefined1 (*) [16])(lVar8 + (uVar108 + uVar107) * (long)p_Var7);
                  lVar114 = uVar108 + uVar107 + 1;
                  auVar143 = *(undefined1 (*) [16])(lVar8 + lVar114 * (long)p_Var7);
                  uVar100 = (ulong)(-1 < (short)uVar3);
                  auVar144 = *(undefined1 (*) [16])(lVar8 + (uVar108 + uVar100 + 1) * (long)p_Var7);
                  lVar115 = uVar100 + lVar114;
                  auVar158 = *(undefined1 (*) [16])(lVar8 + lVar115 * (long)p_Var7);
                  uVar100 = 0;
                  if (-1 < (short)uVar4) {
                    uVar100 = uVar107;
                  }
                  auVar129 = *(undefined1 (*) [16])
                              (lVar8 + (uVar108 + uVar107 + uVar100) * (long)p_Var7);
                  auVar134 = *(undefined1 (*) [16])(lVar8 + (lVar114 + uVar100) * (long)p_Var7);
                  auVar135 = *(undefined1 (*) [16])(lVar8 + (uVar100 + lVar115) * (long)p_Var7);
                  auVar151 = vunpcklps_avx(auVar147,auVar143);
                  auVar147 = vunpckhps_avx(auVar147,auVar143);
                  auVar159 = vunpcklps_avx(auVar118,auVar157);
                  auVar145 = vunpckhps_avx(auVar118,auVar157);
                  auVar145 = vunpcklps_avx(auVar147,auVar145);
                  auVar160 = vunpcklps_avx(auVar151,auVar159);
                  auVar147 = vunpckhps_avx(auVar151,auVar159);
                  auVar151 = vunpcklps_avx(auVar118,auVar158);
                  auVar118 = vunpckhps_avx(auVar118,auVar158);
                  auVar159 = vunpcklps_avx(auVar144,auVar143);
                  auVar144 = vunpckhps_avx(auVar144,auVar143);
                  auVar165 = vunpcklps_avx(auVar118,auVar144);
                  auVar169 = vunpcklps_avx(auVar151,auVar159);
                  auVar118 = vunpckhps_avx(auVar151,auVar159);
                  auVar151 = vunpcklps_avx(auVar143,auVar135);
                  auVar144 = vunpckhps_avx(auVar143,auVar135);
                  auVar135 = vunpcklps_avx(auVar158,auVar134);
                  auVar158 = vunpckhps_avx(auVar158,auVar134);
                  auVar158 = vunpcklps_avx(auVar144,auVar158);
                  auVar159 = vunpcklps_avx(auVar151,auVar135);
                  auVar144 = vunpckhps_avx(auVar151,auVar135);
                  auVar135 = vunpcklps_avx(auVar157,auVar134);
                  auVar157 = vunpckhps_avx(auVar157,auVar134);
                  auVar134 = vunpcklps_avx(auVar143,auVar129);
                  auVar143 = vunpckhps_avx(auVar143,auVar129);
                  auVar143 = vunpcklps_avx(auVar157,auVar143);
                  auVar129 = vunpcklps_avx(auVar135,auVar134);
                  auVar157 = vunpckhps_avx(auVar135,auVar134);
                  auVar154._16_16_ = auVar159;
                  auVar154._0_16_ = auVar160;
                  auVar163._16_16_ = auVar144;
                  auVar163._0_16_ = auVar147;
                  auVar173._16_16_ = auVar158;
                  auVar173._0_16_ = auVar145;
                  auVar149._16_16_ = auVar169;
                  auVar149._0_16_ = auVar169;
                  auVar178._16_16_ = auVar118;
                  auVar178._0_16_ = auVar118;
                  auVar138._16_16_ = auVar165;
                  auVar138._0_16_ = auVar165;
                  auVar132._16_16_ = auVar129;
                  auVar132._0_16_ = auVar129;
                  auVar200._16_16_ = auVar157;
                  auVar200._0_16_ = auVar157;
                  auVar208._16_16_ = auVar143;
                  auVar208._0_16_ = auVar143;
                  local_1540 = vsubps_avx(auVar154,auVar149);
                  local_1520 = vsubps_avx(auVar163,auVar178);
                  auVar130 = vsubps_avx(auVar173,auVar138);
                  auVar140 = vsubps_avx(auVar132,auVar154);
                  auVar11 = vsubps_avx(auVar200,auVar163);
                  auVar69 = vsubps_avx(auVar208,auVar173);
                  fVar124 = local_1520._0_4_;
                  fVar207 = auVar69._0_4_;
                  fVar15 = local_1520._4_4_;
                  fVar210 = auVar69._4_4_;
                  auVar80._4_4_ = fVar210 * fVar15;
                  auVar80._0_4_ = fVar207 * fVar124;
                  fVar24 = local_1520._8_4_;
                  fVar211 = auVar69._8_4_;
                  auVar80._8_4_ = fVar211 * fVar24;
                  fVar33 = local_1520._12_4_;
                  fVar212 = auVar69._12_4_;
                  auVar80._12_4_ = fVar212 * fVar33;
                  fVar42 = local_1520._16_4_;
                  fVar213 = auVar69._16_4_;
                  auVar80._16_4_ = fVar213 * fVar42;
                  fVar51 = local_1520._20_4_;
                  fVar214 = auVar69._20_4_;
                  auVar80._20_4_ = fVar214 * fVar51;
                  fVar60 = local_1520._24_4_;
                  fVar215 = auVar69._24_4_;
                  auVar80._24_4_ = fVar215 * fVar60;
                  auVar80._28_4_ = auVar129._12_4_;
                  fVar126 = auVar130._0_4_;
                  fVar198 = auVar11._0_4_;
                  fVar16 = auVar130._4_4_;
                  fVar201 = auVar11._4_4_;
                  auVar82._4_4_ = fVar201 * fVar16;
                  auVar82._0_4_ = fVar198 * fVar126;
                  fVar25 = auVar130._8_4_;
                  fVar202 = auVar11._8_4_;
                  auVar82._8_4_ = fVar202 * fVar25;
                  fVar34 = auVar130._12_4_;
                  fVar203 = auVar11._12_4_;
                  auVar82._12_4_ = fVar203 * fVar34;
                  fVar43 = auVar130._16_4_;
                  fVar204 = auVar11._16_4_;
                  auVar82._16_4_ = fVar204 * fVar43;
                  fVar52 = auVar130._20_4_;
                  fVar205 = auVar11._20_4_;
                  auVar82._20_4_ = fVar205 * fVar52;
                  fVar61 = auVar130._24_4_;
                  uVar81 = auVar165._12_4_;
                  fVar206 = auVar11._24_4_;
                  auVar82._24_4_ = fVar206 * fVar61;
                  auVar82._28_4_ = uVar81;
                  local_1460 = vsubps_avx(auVar82,auVar80);
                  fVar180 = auVar140._0_4_;
                  fVar185 = auVar140._4_4_;
                  auVar83._4_4_ = fVar185 * fVar16;
                  auVar83._0_4_ = fVar180 * fVar126;
                  fVar187 = auVar140._8_4_;
                  auVar83._8_4_ = fVar187 * fVar25;
                  fVar189 = auVar140._12_4_;
                  auVar83._12_4_ = fVar189 * fVar34;
                  fVar191 = auVar140._16_4_;
                  auVar83._16_4_ = fVar191 * fVar43;
                  fVar193 = auVar140._20_4_;
                  auVar83._20_4_ = fVar193 * fVar52;
                  fVar195 = auVar140._24_4_;
                  auVar83._24_4_ = fVar195 * fVar61;
                  auVar83._28_4_ = uVar81;
                  fVar128 = local_1540._0_4_;
                  fVar17 = local_1540._4_4_;
                  auVar85._4_4_ = fVar210 * fVar17;
                  auVar85._0_4_ = fVar207 * fVar128;
                  fVar26 = local_1540._8_4_;
                  auVar85._8_4_ = fVar211 * fVar26;
                  fVar35 = local_1540._12_4_;
                  auVar85._12_4_ = fVar212 * fVar35;
                  fVar44 = local_1540._16_4_;
                  auVar85._16_4_ = fVar213 * fVar44;
                  fVar53 = local_1540._20_4_;
                  auVar85._20_4_ = fVar214 * fVar53;
                  fVar62 = local_1540._24_4_;
                  fVar84 = auVar169._12_4_;
                  auVar85._24_4_ = fVar215 * fVar62;
                  auVar85._28_4_ = fVar84;
                  auVar130 = vsubps_avx(auVar85,auVar83);
                  auVar86._4_4_ = fVar201 * fVar17;
                  auVar86._0_4_ = fVar198 * fVar128;
                  auVar86._8_4_ = fVar202 * fVar26;
                  auVar86._12_4_ = fVar203 * fVar35;
                  auVar86._16_4_ = fVar204 * fVar44;
                  auVar86._20_4_ = fVar205 * fVar53;
                  auVar86._24_4_ = fVar206 * fVar62;
                  auVar86._28_4_ = fVar84;
                  auVar87._4_4_ = fVar185 * fVar15;
                  auVar87._0_4_ = fVar180 * fVar124;
                  auVar87._8_4_ = fVar187 * fVar24;
                  auVar87._12_4_ = fVar189 * fVar33;
                  auVar87._16_4_ = fVar191 * fVar42;
                  auVar87._20_4_ = fVar193 * fVar51;
                  auVar87._24_4_ = fVar195 * fVar60;
                  auVar87._28_4_ = local_1520._28_4_;
                  local_1560 = vsubps_avx(auVar87,auVar86);
                  uVar110 = *(undefined4 *)&(ray->org).field_0;
                  auVar216._4_4_ = uVar110;
                  auVar216._0_4_ = uVar110;
                  auVar216._8_4_ = uVar110;
                  auVar216._12_4_ = uVar110;
                  auVar216._16_4_ = uVar110;
                  auVar216._20_4_ = uVar110;
                  auVar216._24_4_ = uVar110;
                  auVar216._28_4_ = uVar110;
                  uVar110 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
                  auVar218._4_4_ = uVar110;
                  auVar218._0_4_ = uVar110;
                  auVar218._8_4_ = uVar110;
                  auVar218._12_4_ = uVar110;
                  auVar218._16_4_ = uVar110;
                  auVar218._20_4_ = uVar110;
                  auVar218._24_4_ = uVar110;
                  auVar218._28_4_ = uVar110;
                  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
                  auVar220._4_4_ = uVar1;
                  auVar220._0_4_ = uVar1;
                  auVar220._8_4_ = uVar1;
                  auVar220._12_4_ = uVar1;
                  auVar220._16_4_ = uVar1;
                  auVar220._20_4_ = uVar1;
                  auVar220._24_4_ = uVar1;
                  auVar220._28_4_ = uVar1;
                  fVar117 = (ray->dir).field_0.m128[1];
                  auVar70 = vsubps_avx(auVar154,auVar216);
                  fVar122 = (ray->dir).field_0.m128[2];
                  auVar71 = vsubps_avx(auVar163,auVar218);
                  auVar72 = vsubps_avx(auVar173,auVar220);
                  fVar125 = auVar72._0_4_;
                  fVar18 = auVar72._4_4_;
                  auVar88._4_4_ = fVar117 * fVar18;
                  auVar88._0_4_ = fVar117 * fVar125;
                  fVar27 = auVar72._8_4_;
                  auVar88._8_4_ = fVar117 * fVar27;
                  fVar36 = auVar72._12_4_;
                  auVar88._12_4_ = fVar117 * fVar36;
                  fVar45 = auVar72._16_4_;
                  auVar88._16_4_ = fVar117 * fVar45;
                  fVar54 = auVar72._20_4_;
                  auVar88._20_4_ = fVar117 * fVar54;
                  fVar63 = auVar72._24_4_;
                  auVar88._24_4_ = fVar117 * fVar63;
                  auVar88._28_4_ = uVar110;
                  fVar127 = auVar71._0_4_;
                  fVar19 = auVar71._4_4_;
                  auVar89._4_4_ = fVar122 * fVar19;
                  auVar89._0_4_ = fVar122 * fVar127;
                  fVar28 = auVar71._8_4_;
                  auVar89._8_4_ = fVar122 * fVar28;
                  fVar37 = auVar71._12_4_;
                  auVar89._12_4_ = fVar122 * fVar37;
                  fVar46 = auVar71._16_4_;
                  auVar89._16_4_ = fVar122 * fVar46;
                  fVar55 = auVar71._20_4_;
                  auVar89._20_4_ = fVar122 * fVar55;
                  fVar64 = auVar71._24_4_;
                  auVar89._24_4_ = fVar122 * fVar64;
                  auVar89._28_4_ = uVar1;
                  auVar71 = vsubps_avx(auVar89,auVar88);
                  fVar123 = (ray->dir).field_0.m128[0];
                  fVar121 = auVar70._0_4_;
                  fVar20 = auVar70._4_4_;
                  auVar90._4_4_ = fVar122 * fVar20;
                  auVar90._0_4_ = fVar122 * fVar121;
                  fVar29 = auVar70._8_4_;
                  auVar90._8_4_ = fVar122 * fVar29;
                  fVar38 = auVar70._12_4_;
                  auVar90._12_4_ = fVar122 * fVar38;
                  fVar47 = auVar70._16_4_;
                  auVar90._16_4_ = fVar122 * fVar47;
                  fVar56 = auVar70._20_4_;
                  auVar90._20_4_ = fVar122 * fVar56;
                  fVar65 = auVar70._24_4_;
                  auVar90._24_4_ = fVar122 * fVar65;
                  auVar90._28_4_ = local_1460._28_4_;
                  auVar91._4_4_ = fVar123 * fVar18;
                  auVar91._0_4_ = fVar123 * fVar125;
                  auVar91._8_4_ = fVar123 * fVar27;
                  auVar91._12_4_ = fVar123 * fVar36;
                  auVar91._16_4_ = fVar123 * fVar45;
                  auVar91._20_4_ = fVar123 * fVar54;
                  auVar91._24_4_ = fVar123 * fVar63;
                  auVar91._28_4_ = uVar81;
                  auVar70 = vsubps_avx(auVar91,auVar90);
                  auVar92._4_4_ = fVar123 * fVar19;
                  auVar92._0_4_ = fVar123 * fVar127;
                  auVar92._8_4_ = fVar123 * fVar28;
                  auVar92._12_4_ = fVar123 * fVar37;
                  auVar92._16_4_ = fVar123 * fVar46;
                  auVar92._20_4_ = fVar123 * fVar55;
                  auVar92._24_4_ = fVar123 * fVar64;
                  auVar92._28_4_ = uVar81;
                  auVar93._4_4_ = fVar117 * fVar20;
                  auVar93._0_4_ = fVar117 * fVar121;
                  auVar93._8_4_ = fVar117 * fVar29;
                  auVar93._12_4_ = fVar117 * fVar38;
                  auVar93._16_4_ = fVar117 * fVar47;
                  auVar93._20_4_ = fVar117 * fVar56;
                  auVar93._24_4_ = fVar117 * fVar65;
                  auVar93._28_4_ = fVar84;
                  auVar73 = vsubps_avx(auVar93,auVar92);
                  fVar12 = local_1560._0_4_;
                  fVar21 = local_1560._4_4_;
                  fVar30 = local_1560._8_4_;
                  fVar39 = local_1560._12_4_;
                  fVar48 = local_1560._16_4_;
                  fVar57 = local_1560._20_4_;
                  fVar66 = local_1560._24_4_;
                  fVar13 = auVar130._0_4_;
                  fVar22 = auVar130._4_4_;
                  fVar31 = auVar130._8_4_;
                  fVar40 = auVar130._12_4_;
                  fVar49 = auVar130._16_4_;
                  fVar58 = auVar130._20_4_;
                  fVar67 = auVar130._24_4_;
                  fVar14 = local_1460._0_4_;
                  fVar23 = local_1460._4_4_;
                  fVar32 = local_1460._8_4_;
                  fVar41 = local_1460._12_4_;
                  fVar50 = local_1460._16_4_;
                  fVar59 = local_1460._20_4_;
                  fVar68 = local_1460._24_4_;
                  auVar150._0_4_ = fVar123 * fVar14 + fVar117 * fVar13 + fVar122 * fVar12;
                  auVar150._4_4_ = fVar123 * fVar23 + fVar117 * fVar22 + fVar122 * fVar21;
                  auVar150._8_4_ = fVar123 * fVar32 + fVar117 * fVar31 + fVar122 * fVar30;
                  auVar150._12_4_ = fVar123 * fVar41 + fVar117 * fVar40 + fVar122 * fVar39;
                  auVar150._16_4_ = fVar123 * fVar50 + fVar117 * fVar49 + fVar122 * fVar48;
                  auVar150._20_4_ = fVar123 * fVar59 + fVar117 * fVar58 + fVar122 * fVar57;
                  auVar150._24_4_ = fVar123 * fVar68 + fVar117 * fVar67 + fVar122 * fVar66;
                  auVar150._28_4_ = fVar122 + fVar122 + fVar84;
                  auVar139._8_4_ = 0x80000000;
                  auVar139._0_8_ = 0x8000000080000000;
                  auVar139._12_4_ = 0x80000000;
                  auVar139._16_4_ = 0x80000000;
                  auVar139._20_4_ = 0x80000000;
                  auVar139._24_4_ = 0x80000000;
                  auVar139._28_4_ = 0x80000000;
                  auVar130 = vandps_avx(auVar150,auVar139);
                  uVar181 = auVar130._0_4_;
                  auVar167._0_4_ =
                       (float)(uVar181 ^
                              (uint)(fVar180 * auVar71._0_4_ +
                                    fVar198 * auVar70._0_4_ + fVar207 * auVar73._0_4_));
                  uVar186 = auVar130._4_4_;
                  auVar167._4_4_ =
                       (float)(uVar186 ^
                              (uint)(fVar185 * auVar71._4_4_ +
                                    fVar201 * auVar70._4_4_ + fVar210 * auVar73._4_4_));
                  uVar188 = auVar130._8_4_;
                  auVar167._8_4_ =
                       (float)(uVar188 ^
                              (uint)(fVar187 * auVar71._8_4_ +
                                    fVar202 * auVar70._8_4_ + fVar211 * auVar73._8_4_));
                  uVar190 = auVar130._12_4_;
                  auVar167._12_4_ =
                       (float)(uVar190 ^
                              (uint)(fVar189 * auVar71._12_4_ +
                                    fVar203 * auVar70._12_4_ + fVar212 * auVar73._12_4_));
                  uVar192 = auVar130._16_4_;
                  auVar167._16_4_ =
                       (float)(uVar192 ^
                              (uint)(fVar191 * auVar71._16_4_ +
                                    fVar204 * auVar70._16_4_ + fVar213 * auVar73._16_4_));
                  uVar194 = auVar130._20_4_;
                  auVar167._20_4_ =
                       (float)(uVar194 ^
                              (uint)(fVar193 * auVar71._20_4_ +
                                    fVar205 * auVar70._20_4_ + fVar214 * auVar73._20_4_));
                  uVar196 = auVar130._24_4_;
                  auVar167._24_4_ =
                       (float)(uVar196 ^
                              (uint)(fVar195 * auVar71._24_4_ +
                                    fVar206 * auVar70._24_4_ + fVar215 * auVar73._24_4_));
                  uVar197 = auVar130._28_4_;
                  auVar167._28_4_ =
                       (float)(uVar197 ^ (uint)(auVar140._28_4_ + auVar11._28_4_ + auVar69._28_4_));
                  auVar179._0_4_ =
                       (float)(uVar181 ^
                              (uint)(auVar71._0_4_ * fVar128 +
                                    auVar70._0_4_ * fVar124 + fVar126 * auVar73._0_4_));
                  auVar179._4_4_ =
                       (float)(uVar186 ^
                              (uint)(auVar71._4_4_ * fVar17 +
                                    auVar70._4_4_ * fVar15 + fVar16 * auVar73._4_4_));
                  auVar179._8_4_ =
                       (float)(uVar188 ^
                              (uint)(auVar71._8_4_ * fVar26 +
                                    auVar70._8_4_ * fVar24 + fVar25 * auVar73._8_4_));
                  auVar179._12_4_ =
                       (float)(uVar190 ^
                              (uint)(auVar71._12_4_ * fVar35 +
                                    auVar70._12_4_ * fVar33 + fVar34 * auVar73._12_4_));
                  auVar179._16_4_ =
                       (float)(uVar192 ^
                              (uint)(auVar71._16_4_ * fVar44 +
                                    auVar70._16_4_ * fVar42 + fVar43 * auVar73._16_4_));
                  auVar179._20_4_ =
                       (float)(uVar194 ^
                              (uint)(auVar71._20_4_ * fVar53 +
                                    auVar70._20_4_ * fVar51 + fVar52 * auVar73._20_4_));
                  auVar179._24_4_ =
                       (float)(uVar196 ^
                              (uint)(auVar71._24_4_ * fVar62 +
                                    auVar70._24_4_ * fVar60 + fVar61 * auVar73._24_4_));
                  auVar179._28_4_ =
                       (float)(uVar197 ^ (uint)(local_1460._28_4_ + auVar70._28_4_ + auVar73._28_4_)
                              );
                  auVar140 = ZEXT1232(ZEXT812(0)) << 0x20;
                  auVar130 = vcmpps_avx(auVar167,auVar140,5);
                  auVar140 = vcmpps_avx(auVar179,auVar140,5);
                  auVar130 = vandps_avx(auVar130,auVar140);
                  auVar120._8_4_ = 0x7fffffff;
                  auVar120._0_8_ = 0x7fffffff7fffffff;
                  auVar120._12_4_ = 0x7fffffff;
                  auVar120._16_4_ = 0x7fffffff;
                  auVar120._20_4_ = 0x7fffffff;
                  auVar120._24_4_ = 0x7fffffff;
                  auVar120._28_4_ = 0x7fffffff;
                  local_1360 = vandps_avx(auVar150,auVar120);
                  auVar140 = vcmpps_avx(auVar150,ZEXT1232(ZEXT812(0)) << 0x20,4);
                  auVar130 = vandps_avx(auVar130,auVar140);
                  auVar141._0_4_ = auVar179._0_4_ + auVar167._0_4_;
                  auVar141._4_4_ = auVar179._4_4_ + auVar167._4_4_;
                  auVar141._8_4_ = auVar179._8_4_ + auVar167._8_4_;
                  auVar141._12_4_ = auVar179._12_4_ + auVar167._12_4_;
                  auVar141._16_4_ = auVar179._16_4_ + auVar167._16_4_;
                  auVar141._20_4_ = auVar179._20_4_ + auVar167._20_4_;
                  auVar141._24_4_ = auVar179._24_4_ + auVar167._24_4_;
                  auVar141._28_4_ = auVar179._28_4_ + auVar167._28_4_;
                  auVar11 = vcmpps_avx(auVar141,local_1360,2);
                  auVar140 = vandps_avx(auVar130,auVar11);
                  auVar69 = local_13e0 & auVar140;
                  if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar69 >> 0x7f,0) != '\0') ||
                        (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar69 >> 0xbf,0) != '\0') ||
                      (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar69[0x1f] < '\0') {
                    auVar140 = vandps_avx(auVar140,local_13e0);
                    local_1380._0_4_ =
                         (float)(uVar181 ^
                                (uint)(fVar14 * fVar121 + fVar13 * fVar127 + fVar125 * fVar12));
                    local_1380._4_4_ =
                         (float)(uVar186 ^
                                (uint)(fVar23 * fVar20 + fVar22 * fVar19 + fVar18 * fVar21));
                    local_1380._8_4_ =
                         (float)(uVar188 ^
                                (uint)(fVar32 * fVar29 + fVar31 * fVar28 + fVar27 * fVar30));
                    local_1380._12_4_ =
                         (float)(uVar190 ^
                                (uint)(fVar41 * fVar38 + fVar40 * fVar37 + fVar36 * fVar39));
                    local_1380._16_4_ =
                         (float)(uVar192 ^
                                (uint)(fVar50 * fVar47 + fVar49 * fVar46 + fVar45 * fVar48));
                    local_1380._20_4_ =
                         (float)(uVar194 ^
                                (uint)(fVar59 * fVar56 + fVar58 * fVar55 + fVar54 * fVar57));
                    local_1380._24_4_ =
                         (float)(uVar196 ^
                                (uint)(fVar68 * fVar65 + fVar67 * fVar64 + fVar63 * fVar66));
                    local_1380._28_4_ =
                         uVar197 ^ (uint)(auVar11._28_4_ + auVar11._28_4_ + auVar130._28_4_);
                    fVar117 = (ray->org).field_0.m128[3];
                    fVar122 = local_1360._0_4_;
                    fVar123 = local_1360._4_4_;
                    auVar94._4_4_ = fVar123 * fVar117;
                    auVar94._0_4_ = fVar122 * fVar117;
                    fVar124 = local_1360._8_4_;
                    auVar94._8_4_ = fVar124 * fVar117;
                    fVar126 = local_1360._12_4_;
                    auVar94._12_4_ = fVar126 * fVar117;
                    fVar128 = local_1360._16_4_;
                    auVar94._16_4_ = fVar128 * fVar117;
                    fVar125 = local_1360._20_4_;
                    auVar94._20_4_ = fVar125 * fVar117;
                    fVar127 = local_1360._24_4_;
                    auVar94._24_4_ = fVar127 * fVar117;
                    auVar94._28_4_ = fVar117;
                    auVar130 = vcmpps_avx(auVar94,local_1380,1);
                    fVar117 = ray->tfar;
                    auVar95._4_4_ = fVar123 * fVar117;
                    auVar95._0_4_ = fVar122 * fVar117;
                    auVar95._8_4_ = fVar124 * fVar117;
                    auVar95._12_4_ = fVar126 * fVar117;
                    auVar95._16_4_ = fVar128 * fVar117;
                    auVar95._20_4_ = fVar125 * fVar117;
                    auVar95._24_4_ = fVar127 * fVar117;
                    auVar95._28_4_ = fVar117;
                    auVar11 = vcmpps_avx(local_1380,auVar95,2);
                    auVar130 = vandps_avx(auVar11,auVar130);
                    auVar11 = auVar140 & auVar130;
                    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar11 >> 0x7f,0) != '\0') ||
                          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar11 >> 0xbf,0) != '\0') ||
                        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar11[0x1f] < '\0') {
                      local_1320 = vandps_avx(auVar140,auVar130);
                      auVar130 = vsubps_avx(local_1360,auVar179);
                      auVar130 = vblendvps_avx(auVar167,auVar130,local_1220);
                      auVar140 = vsubps_avx(local_1360,auVar167);
                      auVar140 = vblendvps_avx(auVar179,auVar140,local_1220);
                      local_12a0[0] = fVar14 * (float)local_1240._0_4_;
                      local_12a0[1] = fVar23 * (float)local_1240._4_4_;
                      local_12a0[2] = fVar32 * fStack_1238;
                      local_12a0[3] = fVar41 * fStack_1234;
                      fStack_1290 = fVar50 * fStack_1230;
                      fStack_128c = fVar59 * fStack_122c;
                      fStack_1288 = fVar68 * fStack_1228;
                      fStack_1284 = auVar179._28_4_;
                      local_1280[0] = fVar13 * (float)local_1240._0_4_;
                      local_1280[1] = fVar22 * (float)local_1240._4_4_;
                      local_1280[2] = fVar31 * fStack_1238;
                      local_1280[3] = fVar40 * fStack_1234;
                      fStack_1270 = fVar49 * fStack_1230;
                      fStack_126c = fVar58 * fStack_122c;
                      fStack_1268 = fVar67 * fStack_1228;
                      fStack_1264 = auVar179._28_4_;
                      local_1260[0] = (float)local_1240._0_4_ * fVar12;
                      local_1260[1] = (float)local_1240._4_4_ * fVar21;
                      local_1260[2] = fStack_1238 * fVar30;
                      local_1260[3] = fStack_1234 * fVar39;
                      fStack_1250 = fStack_1230 * fVar48;
                      fStack_124c = fStack_122c * fVar57;
                      fStack_1248 = fStack_1228 * fVar66;
                      fStack_1244 = auVar179._28_4_;
                      auVar147 = vpshufd_avx(ZEXT416(uVar103),0);
                      auVar147 = vpaddd_avx(auVar147,_DAT_0201c990);
                      auVar118 = vpshufd_avx(ZEXT416(uVar105),0);
                      auVar118 = vpaddd_avx(auVar118,_DAT_0201c9a0);
                      auVar146._0_4_ = (float)(int)(*(ushort *)(lVar99 + 8 + lVar102) - 1);
                      auVar171._4_12_ = auVar72._4_12_;
                      auVar146._4_12_ = auVar171._4_12_;
                      auVar157 = vrcpss_avx(auVar146,auVar146);
                      auVar171._0_4_ = (float)(int)(*(ushort *)(lVar99 + 10 + lVar102) - 1);
                      auVar143 = vrcpss_avx(auVar171,auVar171);
                      auVar133._16_16_ = auVar147;
                      auVar133._0_16_ = auVar147;
                      auVar11 = vcvtdq2ps_avx(auVar133);
                      fStack_13a4 = auVar11._28_4_ + auVar130._28_4_;
                      auVar147 = ZEXT416((uint)(auVar157._0_4_ *
                                               (2.0 - auVar157._0_4_ * auVar146._0_4_)));
                      auVar147 = vshufps_avx(auVar147,auVar147,0);
                      local_13c0 = (fVar122 * auVar11._0_4_ + auVar130._0_4_) * auVar147._0_4_;
                      fStack_13bc = (fVar123 * auVar11._4_4_ + auVar130._4_4_) * auVar147._4_4_;
                      fStack_13b8 = (fVar124 * auVar11._8_4_ + auVar130._8_4_) * auVar147._8_4_;
                      fStack_13b4 = (fVar126 * auVar11._12_4_ + auVar130._12_4_) * auVar147._12_4_;
                      fStack_13b0 = (fVar128 * auVar11._16_4_ + auVar130._16_4_) * auVar147._0_4_;
                      fStack_13ac = (fVar125 * auVar11._20_4_ + auVar130._20_4_) * auVar147._4_4_;
                      fStack_13a8 = (fVar127 * auVar11._24_4_ + auVar130._24_4_) * auVar147._8_4_;
                      auVar142._16_16_ = auVar118;
                      auVar142._0_16_ = auVar118;
                      auVar130 = vcvtdq2ps_avx(auVar142);
                      auVar147 = ZEXT416((uint)(auVar143._0_4_ *
                                               (2.0 - auVar143._0_4_ * auVar171._0_4_)));
                      auVar147 = vshufps_avx(auVar147,auVar147,0);
                      local_13a0 = (fVar122 * auVar130._0_4_ + auVar140._0_4_) * auVar147._0_4_;
                      fStack_139c = (fVar123 * auVar130._4_4_ + auVar140._4_4_) * auVar147._4_4_;
                      fStack_1398 = (fVar124 * auVar130._8_4_ + auVar140._8_4_) * auVar147._8_4_;
                      fStack_1394 = (fVar126 * auVar130._12_4_ + auVar140._12_4_) * auVar147._12_4_;
                      fStack_1390 = (fVar128 * auVar130._16_4_ + auVar140._16_4_) * auVar147._0_4_;
                      fStack_138c = (fVar125 * auVar130._20_4_ + auVar140._20_4_) * auVar147._4_4_;
                      fStack_1388 = (fVar127 * auVar130._24_4_ + auVar140._24_4_) * auVar147._8_4_;
                      fStack_1384 = auVar130._28_4_ + auVar140._28_4_;
                      if ((pGVar6->mask & ray->mask) != 0) {
                        pRVar9 = context->args;
                        if ((pRVar9->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar130 = vrcpps_avx(local_1360);
                          fVar117 = auVar130._0_4_;
                          fVar121 = auVar130._4_4_;
                          auVar96._4_4_ = fVar123 * fVar121;
                          auVar96._0_4_ = fVar122 * fVar117;
                          fVar122 = auVar130._8_4_;
                          auVar96._8_4_ = fVar124 * fVar122;
                          fVar123 = auVar130._12_4_;
                          auVar96._12_4_ = fVar126 * fVar123;
                          fVar124 = auVar130._16_4_;
                          auVar96._16_4_ = fVar128 * fVar124;
                          fVar126 = auVar130._20_4_;
                          auVar96._20_4_ = fVar125 * fVar126;
                          fVar128 = auVar130._24_4_;
                          auVar96._24_4_ = fVar127 * fVar128;
                          auVar96._28_4_ = local_1360._28_4_;
                          auVar155._8_4_ = 0x3f800000;
                          auVar155._0_8_ = &DAT_3f8000003f800000;
                          auVar155._12_4_ = 0x3f800000;
                          auVar155._16_4_ = 0x3f800000;
                          auVar155._20_4_ = 0x3f800000;
                          auVar155._24_4_ = 0x3f800000;
                          auVar155._28_4_ = 0x3f800000;
                          auVar140 = vsubps_avx(auVar155,auVar96);
                          fVar117 = fVar117 + fVar117 * auVar140._0_4_;
                          fVar121 = fVar121 + fVar121 * auVar140._4_4_;
                          fVar122 = fVar122 + fVar122 * auVar140._8_4_;
                          fVar123 = fVar123 + fVar123 * auVar140._12_4_;
                          fVar124 = fVar124 + fVar124 * auVar140._16_4_;
                          fVar126 = fVar126 + fVar126 * auVar140._20_4_;
                          fVar128 = fVar128 + fVar128 * auVar140._24_4_;
                          local_12c0[0] = fVar117 * local_1380._0_4_;
                          local_12c0[1] = fVar121 * local_1380._4_4_;
                          local_12c0[2] = fVar122 * local_1380._8_4_;
                          local_12c0[3] = fVar123 * local_1380._12_4_;
                          fStack_12b0 = fVar124 * local_1380._16_4_;
                          fStack_12ac = fVar126 * local_1380._20_4_;
                          fStack_12a8 = fVar128 * local_1380._24_4_;
                          fStack_12a4 = auVar130._28_4_;
                          local_1300[0] = local_13c0 * fVar117;
                          local_1300[1] = fStack_13bc * fVar121;
                          local_1300[2] = fStack_13b8 * fVar122;
                          local_1300[3] = fStack_13b4 * fVar123;
                          fStack_12f0 = fStack_13b0 * fVar124;
                          fStack_12ec = fStack_13ac * fVar126;
                          fStack_12e8 = fStack_13a8 * fVar128;
                          fStack_12e4 = fStack_13a4;
                          local_12e0[0] = local_13a0 * fVar117;
                          local_12e0[1] = fStack_139c * fVar121;
                          local_12e0[2] = fStack_1398 * fVar122;
                          local_12e0[3] = fStack_1394 * fVar123;
                          fStack_12d0 = fStack_1390 * fVar124;
                          fStack_12cc = fStack_138c * fVar126;
                          fStack_12c8 = fStack_1388 * fVar128;
                          fStack_12c4 = auVar130._28_4_ + auVar140._28_4_;
                          iVar98 = vmovmskps_avx(local_1320);
                          uVar100 = CONCAT44((int)((ulong)context >> 0x20),iVar98);
                          lVar99 = 0;
                          if (uVar100 != 0) {
                            for (; (uVar100 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                            }
                          }
                          local_1540._0_8_ = lVar99;
                          local_1520._0_8_ = uVar100;
                          local_1560[0] = iVar98 != 0;
                          if (iVar98 != 0) {
                            pRVar10 = context->user;
                            do {
                              local_15b4 = local_1300[local_1540._0_8_];
                              local_15b0 = local_12e0[local_1540._0_8_];
                              local_1460._0_4_ = ray->tfar;
                              ray->tfar = local_12c0[local_1540._0_8_];
                              local_15c0 = local_12a0[local_1540._0_8_];
                              local_15bc = local_1280[local_1540._0_8_];
                              local_15b8 = local_1260[local_1540._0_8_];
                              local_15ac = uVar5;
                              local_15a8 = uVar97;
                              local_15a4 = pRVar10->instID[0];
                              local_15a0 = pRVar10->instPrimID[0];
                              local_1664 = -1;
                              local_1590.valid = &local_1664;
                              local_1590.geometryUserPtr = pGVar6->userPtr;
                              local_1590.context = pRVar10;
                              local_1590.ray = (RTCRayN *)ray;
                              local_1590.hit = (RTCHitN *)&local_15c0;
                              local_1590.N = 1;
                              if ((pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                                 ((*pGVar6->occlusionFilterN)(&local_1590), *local_1590.valid != 0))
                              {
                                if (pRVar9->filter == (RTCFilterFunctionN)0x0) break;
                                if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar9->filter)(&local_1590);
                                }
                                if (*local_1590.valid != 0) break;
                              }
                              ray->tfar = (float)local_1460._0_4_;
                              uVar100 = local_1520._0_8_ ^ 1L << (local_1540._0_8_ & 0x3f);
                              lVar99 = 0;
                              if (uVar100 != 0) {
                                for (; (uVar100 >> lVar99 & 1) == 0; lVar99 = lVar99 + 1) {
                                }
                              }
                              local_1540._0_8_ = lVar99;
                              local_1520._0_8_ = uVar100;
                              local_1560[0] = uVar100 != 0;
                            } while (uVar100 != 0);
                          }
                          if ((local_1560 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                          goto LAB_00313fde;
                        }
                        auVar209 = ZEXT3264(local_1480);
                        auVar217 = ZEXT3264(local_14a0);
                        auVar219 = ZEXT3264(local_14c0);
                        auVar221 = ZEXT3264(local_14e0);
                        auVar222 = ZEXT3264(local_1500);
                        goto LAB_0031445e;
                      }
                    }
                  }
LAB_00313fde:
                  uVar104 = uVar104 & uVar104 - 1;
                } while (uVar104 != 0);
              }
              local_15e0 = local_15e0 + 1;
              bVar116 = local_15e0 < local_15e8;
              auVar209 = ZEXT3264(local_1480);
              auVar217 = ZEXT3264(local_14a0);
              auVar219 = ZEXT3264(local_14c0);
              auVar221 = ZEXT3264(local_14e0);
              auVar222 = ZEXT3264(local_1500);
            } while (local_15e0 != local_15e8);
          }
LAB_0031445e:
          iVar98 = 0;
          auVar156 = ZEXT3264(_local_1400);
          auVar164 = ZEXT3264(local_1420);
          auVar168 = ZEXT3264(local_1440);
          uVar104 = local_1658;
          uVar100 = local_1638;
          uVar107 = local_1640;
          uVar108 = local_1648;
          uVar109 = local_1650;
          uVar113 = local_1660;
          if (bVar116) {
            ray->tfar = -INFINITY;
            iVar98 = 3;
          }
        }
        unaff_R12 = local_1630;
      } while (iVar98 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }